

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void setShiftPermute(int s)

{
  int iVar1;
  int ss [6];
  int v;
  int local_28 [8];
  int local_8;
  
  local_28[0] = 0;
  for (local_8 = 1; local_8 < 6; local_8 = local_8 + 1) {
    iVar1 = myrand();
    local_28[local_8] = iVar1 % 200;
  }
  for (local_8 = 1; local_8 <= numOfVariables; local_8 = local_8 + 1) {
    permute[local_8] =
         (local_8 + -1 + groupSize * local_28[(local_8 + -1) % groupSize]) % numOfVariables + 1;
  }
  for (local_8 = 1; local_8 <= numOfVariables; local_8 = local_8 + 1) {
    unpermute[permute[local_8]] = local_8;
  }
  return;
}

Assistant:

void setShiftPermute (int s)
{
	int v;
	int ss[6];
	ss[0] = 0;
	for (v=1;v<=5;v++)
		ss[v] = myrand()%200;



	for (v=1;v<=numOfVariables;v++)
		permute[v] = 1 + (v-1+groupSize*ss[(v-1)%groupSize] )%numOfVariables;

	for (v=1;v<=numOfVariables;v++)
		unpermute[permute[v]] = v;

}